

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O1

void libtorrent::utp_stream::on_read
               (void *self,size_t bytes_transferred,error_code *ec,bool shutdown)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  byte *pbVar3;
  code *pcVar4;
  initiate_post local_59;
  _Any_data local_58;
  code *local_48;
  undefined8 local_40;
  size_t local_38;
  undefined8 local_30;
  error_category *peStack_28;
  
  puVar1 = (undefined8 *)((long)self + 0x20);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (code *)0x0;
  local_40 = *(undefined8 *)((long)self + 0x38);
  puVar2 = (undefined8 *)((long)self + 0x30);
  pcVar4 = *(code **)((long)self + 0x30);
  if (pcVar4 != (code *)0x0) {
    local_58._M_unused._0_8_ = (undefined8)*puVar1;
    local_58._8_8_ = *(undefined8 *)((long)self + 0x28);
    *puVar2 = 0;
    *(undefined8 *)((long)self + 0x38) = 0;
    local_48 = pcVar4;
  }
  local_30._0_4_ = ec->val_;
  local_30._4_1_ = ec->failed_;
  local_30._5_3_ = *(undefined3 *)&ec->field_0x5;
  peStack_28 = ec->cat_;
  local_38 = bytes_transferred;
  boost::asio::io_context::initiate_post::operator()
            (&local_59,
             (_Bind_result<void,_std::function<void_(const_boost::system::error_code_&,_unsigned_long)>_(boost::system::error_code,_unsigned_long)>
              *)&local_58,*(io_context **)((long)self + 0x60));
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((code *)*puVar2 != (code *)0x0) {
    (*(code *)*puVar2)(puVar1,puVar1,3);
    *puVar2 = 0;
    *(undefined8 *)((long)self + 0x38) = 0;
  }
  if ((shutdown) && (*(long *)((long)self + 0x68) != 0)) {
    pbVar3 = (byte *)(*(long *)((long)self + 0x68) + 0x21a);
    *pbVar3 = *pbVar3 & 0xbf;
    *(undefined8 *)((long)self + 0x68) = 0;
  }
  return;
}

Assistant:

void utp_stream::on_read(void* self, std::size_t const bytes_transferred
	, error_code const& ec, bool const shutdown)
{
	auto* s = static_cast<utp_stream*>(self);

	UTP_LOGV("%8p: calling read handler read:%d ec:%s shutdown:%d\n", static_cast<void*>(s->m_impl)
		, int(bytes_transferred), ec.message().c_str(), shutdown);

	TORRENT_ASSERT(s->m_read_handler);
	TORRENT_ASSERT(bytes_transferred > 0 || ec || s->m_impl->m_null_buffers);
	s->m_io_service.post(std::bind<void>(std::move(s->m_read_handler), ec, bytes_transferred));
	s->m_read_handler = nullptr;
	if (shutdown && s->m_impl)
	{
		TORRENT_ASSERT(ec);
		detach_utp_impl(s->m_impl);
		s->m_impl = nullptr;
	}
}